

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall Player::notifyAll(Player *this)

{
  _List_node_base *p_Var1;
  iterator __begin1;
  _List_node_base *p_Var2;
  
  p_Var1 = (_List_node_base *)this->pObservers;
  p_Var2 = p_Var1->_M_next;
  if (p_Var2 != p_Var1) {
    do {
      (**(code **)(p_Var2[1]._M_next)->_M_next)();
      p_Var2 = (((_List_base<Observer_*,_std::allocator<Observer_*>_> *)&p_Var2->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
    } while (p_Var2 != p_Var1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "[WARNING] - The current player has no observers currently attached to it.",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  return;
}

Assistant:

void Player::notifyAll() {
    if(this->pObservers->empty()) {
        std::cout << "[WARNING] - The current player has no observers currently attached to it." << std::endl;
        return;
    }
    for(const auto& observer : *this->pObservers) {
        observer->update();
    }
}